

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

JavascriptGeneratorFunction *
Js::JavascriptGeneratorFunction::OP_NewScGenFunc
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  bool bVar1;
  FunctionInfo *this;
  FunctionProxy *this_00;
  ThreadContext *threadContext;
  JavascriptLibrary *this_01;
  GeneratorVirtualScriptFunction *scriptFunction_00;
  JavascriptGeneratorFunction *local_68;
  JavascriptGeneratorFunction *genFunc;
  GeneratorVirtualScriptFunction *scriptFunction;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext;
  FunctionProxy *functionProxy;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  
  this = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
  this_00 = FunctionInfo::GetFunctionProxy(this);
  reentrancylock._24_8_ = FunctionProxy::GetScriptContext(this_00);
  threadContext = ScriptContext::GetThreadContext((ScriptContext *)reentrancylock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)&scriptFunction,threadContext);
  this_01 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
  scriptFunction_00 = JavascriptLibrary::CreateGeneratorVirtualScriptFunction(this_01,this_00);
  ScriptFunction::SetEnvironment(&scriptFunction_00->super_ScriptFunction,environment);
  bVar1 = FunctionProxy::IsAsync(this_00);
  if ((!bVar1) || (bVar1 = FunctionProxy::IsModule(this_00), bVar1)) {
    local_68 = New((ScriptContext *)reentrancylock._24_8_,scriptFunction_00);
  }
  else {
    bVar1 = FunctionProxy::IsGenerator(this_00);
    if (bVar1) {
      local_68 = &JavascriptAsyncGeneratorFunction::New
                            ((ScriptContext *)reentrancylock._24_8_,scriptFunction_00)->
                  super_JavascriptGeneratorFunction;
    }
    else {
      local_68 = &JavascriptAsyncFunction::New
                            ((ScriptContext *)reentrancylock._24_8_,scriptFunction_00)->
                  super_JavascriptGeneratorFunction;
    }
  }
  GeneratorVirtualScriptFunction::SetRealGeneratorFunction(scriptFunction_00,local_68);
  JsReentLock::~JsReentLock((JsReentLock *)&scriptFunction);
  return local_68;
}

Assistant:

JavascriptGeneratorFunction* JavascriptGeneratorFunction::OP_NewScGenFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        ScriptContext* scriptContext = functionProxy->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScGenFunc, reentrancylock, scriptContext->GetThreadContext());

        GeneratorVirtualScriptFunction* scriptFunction = scriptContext->GetLibrary()->CreateGeneratorVirtualScriptFunction(functionProxy);
        scriptFunction->SetEnvironment(environment);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(scriptFunction, EtwTrace::GetFunctionId(functionProxy)));

        JavascriptGeneratorFunction* genFunc = nullptr;
        if (functionProxy->IsAsync() && !functionProxy->IsModule())
        {
            if (functionProxy->IsGenerator())
            {
                genFunc = JavascriptAsyncGeneratorFunction::New(scriptContext, scriptFunction);
            }
            else
            {
                genFunc = JavascriptAsyncFunction::New(scriptContext, scriptFunction);
            }
        }
        else
        {
            genFunc = JavascriptGeneratorFunction::New(scriptContext, scriptFunction);
        }

        scriptFunction->SetRealGeneratorFunction(genFunc);

        return genFunc;
        JIT_HELPER_END(ScrFunc_OP_NewScGenFunc);
    }